

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O0

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  Formula *pFVar1;
  bool bVar2;
  MemberSelection MVar3;
  CSymbolType CVar4;
  int iVar5;
  TargetTypeClass TVar6;
  ulong uVar7;
  long *plVar8;
  size_t sVar9;
  INode **ppIVar10;
  undefined4 extraout_var;
  size_type sVar11;
  FormulaNewParam **ppFVar12;
  String *pSVar13;
  reference ppIVar14;
  SidTreeNode *this_00;
  VariableExpression *this_01;
  KinematicInstance *this_02;
  void *pvVar15;
  String *name;
  byte *in_RCX;
  KinematicInstance *kinematicInstance;
  IntermediateTargetable *intermediateTargetable;
  Object *object;
  String *formulaName_1;
  String msg_2;
  SidTreeNode *targetSidTreeNode;
  bool found;
  VariableExpression *variableExpression;
  String msg_1;
  FormulaNewParam *parameter;
  size_t i;
  const_iterator it;
  String *formulaName;
  String msg;
  FormulaNewParamPointerArray *targetFormulaParameters;
  ParameterList *parameters;
  bool fragmentSuccess;
  MathmlAstArray *asts;
  String *fragmentExpressionName;
  FragmentExpression *fragmentExpression;
  Formula *targetFormula;
  UniqueId *formulaUniqueId;
  String *csymbolName;
  SidAddress *targetAddress;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  VariableExpression *in_stack_fffffffffffffc20;
  String *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  FormulasLinker *in_stack_fffffffffffffc38;
  DocumentProcessor *in_stack_fffffffffffffc40;
  CloneFlags cloneFlags;
  String *in_stack_fffffffffffffc48;
  FragmentExpression *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  String *local_330;
  Severity SVar16;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  string local_318 [4];
  ErrorType in_stack_fffffffffffffcec;
  IFilePartLoader *in_stack_fffffffffffffcf0;
  string local_2e0 [32];
  Object *local_2c0;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  String *local_258;
  string local_250 [32];
  string local_230 [24];
  UniqueId *in_stack_fffffffffffffde8;
  string local_210 [24];
  SidAddress *in_stack_fffffffffffffe08;
  int local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [39];
  undefined1 local_151;
  string local_150 [32];
  FormulaNewParam *local_130;
  INode **local_128;
  size_t local_120;
  __normal_iterator<MathML::AST::INode_*const_*,_std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>
  local_118;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  String *local_b0;
  string local_a8 [32];
  FormulaNewParamPointerArray *local_88;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *local_80;
  byte local_71;
  ArrayPrimitiveType<MathML::AST::INode_*> *local_70;
  String *local_58;
  long *local_50;
  Formula *local_48;
  UniqueId *local_40;
  String *local_38;
  SidAddress *local_30;
  byte *local_28;
  COLLADACsymbol *local_20;
  Formula *local_18;
  FormulasLinker *local_10;
  int local_8;
  
  local_28 = in_RCX;
  local_20 = (COLLADACsymbol *)__to;
  local_18 = (Formula *)__from;
  local_10 = this;
  local_30 = COLLADACsymbol::getSidAddress((COLLADACsymbol *)__to);
  local_38 = (String *)0x0;
  SidAddress::getId_abi_cxx11_(local_30);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    SidAddress::getSids_abi_cxx11_(local_30);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc20);
    if ((bVar2) &&
       (MVar3 = SidAddress::getMemberSelection(local_30), MVar3 == MEMBER_SELECTION_NONE)) {
      local_38 = SidAddress::getId_abi_cxx11_(local_30);
    }
  }
  CVar4 = COLLADACsymbol::getCSymbolType(local_20);
  if (CVar4 == FUNCTION) {
    local_40 = COLLADACsymbol::getFormulaUniqueId(local_20);
    local_48 = DocumentProcessor::getFormulaByUniqueId
                         (in_stack_fffffffffffffc40,(UniqueId *)in_stack_fffffffffffffc38);
    cloneFlags = (CloneFlags)((ulong)in_stack_fffffffffffffc40 >> 0x20);
    local_50 = (long *)0x0;
    if (local_48 == (Formula *)0x0) {
      plVar8 = (long *)operator_new(200);
      SVar16 = (Severity)((ulong)this >> 0x20);
      local_151 = 1;
      SidAddress::getSidAddressString_abi_cxx11_(in_stack_fffffffffffffe08);
      MathML::AST::FragmentExpression::FragmentExpression
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,cloneFlags);
      local_151 = 0;
      local_50 = plVar8;
      std::__cxx11::string::~string(local_150);
      COLLADAFW::UniqueId::toAscii_abi_cxx11_(in_stack_fffffffffffffde8);
      std::operator+((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::append((char *)local_178);
      std::__cxx11::string::string(local_1d8,local_178);
      bVar2 = IFilePartLoader::handleFWLError
                        (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                         (String *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                         SVar16);
      *local_28 = bVar2;
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_178);
    }
    else {
      local_58 = (String *)0x0;
      if (local_38 == (String *)0x0) {
        local_330 = COLLADAFW::Formula::getName_abi_cxx11_(local_48);
      }
      else {
        local_330 = local_38;
      }
      local_58 = local_330;
      plVar8 = (long *)operator_new(200);
      MathML::AST::FragmentExpression::FragmentExpression
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,cloneFlags);
      local_50 = plVar8;
      local_70 = COLLADAFW::Formula::getMathmlAsts(local_48);
      sVar9 = COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::getCount(local_70);
      pFVar1 = local_48;
      if (sVar9 == 1) {
        local_71 = 1;
        ppIVar10 = COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::operator[](local_70,0);
        iVar5 = link(this,(char *)pFVar1,(char *)*ppIVar10);
        ppIVar10 = COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::operator[](local_70,0);
        plVar8 = local_50;
        *ppIVar10 = (INode *)CONCAT44(extraout_var,iVar5);
        ppIVar10 = COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::operator[](local_70,0);
        (**(code **)(*plVar8 + 0x38))(plVar8,*ppIVar10);
        if ((local_71 & 1) == 0) {
          return 0;
        }
      }
      local_80 = COLLADACsymbol::getParameterList(local_20);
      local_88 = COLLADAFW::Formula::getNewParams(local_48);
      sVar11 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size
                         (local_80);
      sVar9 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>::getCount
                        (&local_88->super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>);
      if (sVar11 == sVar9) {
        local_118._M_current =
             (INode **)
             std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::begin
                       (in_stack_fffffffffffffc08);
        local_120 = 0;
        while( true ) {
          local_128 = (INode **)
                      std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::end
                                (in_stack_fffffffffffffc08);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<MathML::AST::INode_*const_*,_std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>
                              *)in_stack_fffffffffffffc10,
                             (__normal_iterator<MathML::AST::INode_*const_*,_std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>
                              *)in_stack_fffffffffffffc08);
          if (!bVar2) break;
          ppFVar12 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>::operator[]
                               (&local_88->super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>,
                                local_120);
          plVar8 = local_50;
          local_130 = *ppFVar12;
          pSVar13 = COLLADAFW::FormulaNewParam::getName_abi_cxx11_(local_130);
          pFVar1 = local_18;
          ppIVar14 = __gnu_cxx::
                     __normal_iterator<MathML::AST::INode_*const_*,_std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>
                     ::operator*(&local_118);
          iVar5 = link(this,(char *)pFVar1,(char *)*ppIVar14);
          (**(code **)(*plVar8 + 0x70))(plVar8,pSVar13,iVar5);
          if ((*local_28 & 1) == 0) break;
          __gnu_cxx::
          __normal_iterator<MathML::AST::INode_*const_*,_std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>
          ::operator++(&local_118);
          local_120 = local_120 + 1;
        }
      }
      else {
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc50);
        SVar16 = (Severity)((ulong)this >> 0x20);
        local_b0 = COLLADAFW::Formula::getName_abi_cxx11_(local_18);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc50);
          std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
          std::__cxx11::string::append(local_a8);
          std::__cxx11::string::~string(local_d0);
          std::__cxx11::string::~string(local_f0);
        }
        std::__cxx11::string::append((char *)local_a8);
        std::__cxx11::string::string(local_110,local_a8);
        bVar2 = IFilePartLoader::handleFWLError
                          (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                           (String *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                           SVar16);
        *local_28 = bVar2;
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_a8);
      }
    }
    local_8 = (int)local_50;
  }
  else {
    local_1e0 = 0;
    if (local_38 != (String *)0x0) {
      getNewParamIndex(in_stack_fffffffffffffc38,
                       (Formula *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                       in_stack_fffffffffffffc28,(bool *)in_stack_fffffffffffffc20);
    }
    SVar16 = (Severity)((ulong)this >> 0x20);
    this_00 = DocumentProcessor::resolveSid
                        ((DocumentProcessor *)
                         CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                         (SidAddress *)in_stack_fffffffffffffc50);
    if (this_00 == (SidTreeNode *)0x0) {
      SidAddress::getSidAddressString_abi_cxx11_(in_stack_fffffffffffffe08);
      std::operator+((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string(local_250);
      local_258 = COLLADAFW::Formula::getName_abi_cxx11_(local_18);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc50);
        std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
        std::__cxx11::string::append(local_210);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string(local_298);
      }
      std::__cxx11::string::append((char *)local_210);
      std::__cxx11::string::string(local_2b8,local_210);
      bVar2 = IFilePartLoader::handleFWLError
                        (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                         (String *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                         SVar16);
      *local_28 = bVar2;
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_210);
    }
    else {
      TVar6 = SidTreeNode::getTargetType(this_00);
      if (TVar6 == TARGETTYPECLASS_OBJECT) {
        local_2c0 = SidTreeNode::getObjectTarget(this_00);
        this_01 = (VariableExpression *)operator_new(0x30);
        (*local_2c0->_vptr_Object[3])();
        COLLADAFW::UniqueId::toAscii_abi_cxx11_(in_stack_fffffffffffffde8);
        MathML::AST::VariableExpression::VariableExpression(this_01,in_stack_fffffffffffffc18);
        local_1e0 = (int)this_01;
        std::__cxx11::string::~string(local_2e0);
      }
      else {
        TVar6 = SidTreeNode::getTargetType(this_00);
        if (TVar6 != TARGETTYPECLASS_INTERMEDIATETARGETABLE) {
          *local_28 = 0;
          return 0;
        }
        SidTreeNode::getIntermediateTargetableTarget(this_00);
        this_02 = intermediateTargetableSafeCast<COLLADASaxFWL::KinematicInstance>
                            ((IntermediateTargetable *)in_stack_fffffffffffffc08);
        pvVar15 = operator_new(0x30);
        local_1e0 = (int)pvVar15;
        name = (String *)KinematicInstance::getReplacingObjectUniqueId(this_02);
        COLLADAFW::UniqueId::toAscii_abi_cxx11_(in_stack_fffffffffffffde8);
        MathML::AST::VariableExpression::VariableExpression(in_stack_fffffffffffffc20,name);
        std::__cxx11::string::~string(local_318);
      }
    }
    *local_28 = 1;
    local_8 = local_1e0;
  }
  return local_8;
}

Assistant:

MathML::AST::INode* FormulasLinker::link( COLLADAFW::Formula* formula, COLLADACsymbol* csymbol, bool& success)
	{
		const SidAddress& targetAddress = csymbol->getSidAddress();

		const String* csymbolName = 0;
		// if the address consist of a single word, this is considered to be the csymbol name.
		if ( !targetAddress.getId().empty() && 
			targetAddress.getSids().empty() && 
			targetAddress.getMemberSelection() == SidAddress::MEMBER_SELECTION_NONE )
		{
			csymbolName = &targetAddress.getId();
		}

		if ( csymbol->getCSymbolType() == COLLADACsymbol::FUNCTION )
		{
			const COLLADAFW::UniqueId& formulaUniqueId = csymbol->getFormulaUniqueId();

			COLLADAFW::Formula* targetFormula = mDocumentProcessor->getFormulaByUniqueId(formulaUniqueId);
		
			MathML::AST::FragmentExpression* fragmentExpression = 0;

			if ( targetFormula )
			{
				// find a suitable name for the fragment expression
				// if possible use the string in the csymbol element, otherwise the name of the referenced fromula
				const String* fragmentExpressionName = 0;
				fragmentExpressionName = csymbolName ? csymbolName : &targetFormula->getName();

				fragmentExpression = new MathML::AST::FragmentExpression(*fragmentExpressionName, MathML::AST::INode::CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
				COLLADAFW::MathmlAstArray& asts = targetFormula->getMathmlAsts();
				if ( asts.getCount() == 1)
				{
					// we have to ensure, that the fragment won't change anymore. Therefore we need to link immediately
					bool fragmentSuccess = true;
					asts[0] = link( targetFormula, asts[0], fragmentSuccess);
					fragmentExpression->setFragment( asts[0] );
					if ( !fragmentSuccess )
					{
						return 0;
					}
				}
				const COLLADACsymbol::ParameterList& parameters =  csymbol->getParameterList();
				const COLLADAFW::FormulaNewParamPointerArray& targetFormulaParameters = targetFormula->getNewParams();
				if ( parameters.size() != targetFormulaParameters.getCount() )
				{
					String msg = "Number of newparams in formula \"" + *fragmentExpressionName;
					const String& formulaName = formula->getName();
					if ( !formulaName.empty() )
					{
						msg.append( "referenced in \"" + formulaName + "\" ");
					}
					msg.append( "does not match parameters count." );

					success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_PARAMETER_COUNT_DOESNOT_MATCH, msg);
				}
				else
				{
					COLLADACsymbol::ParameterList::const_iterator it = parameters.begin();
					for ( size_t i = 0; it!=parameters.end(); ++it, ++i )
					{
						const COLLADAFW::FormulaNewParam* parameter = targetFormulaParameters[i];
						fragmentExpression->addParameter(parameter->getName(), link( formula, *it, success));
						if ( !success )
						{
							break;
						}
					}
				}
			}
			else
			{
				// formula not found
				fragmentExpression = new MathML::AST::FragmentExpression(targetAddress.getSidAddressString(), MathML::AST::INode::CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);

				String msg = "Formula with unique id\"" + formulaUniqueId.toAscii() + "\" ";
				msg.append( "could not be found." );

				success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_UNRESOLVED_FORMULA, msg);
			}
			return fragmentExpression;
		}
		else
		{
			MathML::AST::VariableExpression* variableExpression = 0;

			// the csymbol is a parameter. 
			// if the address consist of a single word, it might be a parameter of the formula itself.
			if ( csymbolName )
			{
				//search for the parameter name in the formulas new params
				bool found = false;
				getNewParamIndex(formula, *csymbolName, found);
				if ( found )
				{
					// we are done. create new VariableExpression and return
					variableExpression = FW_NEW MathML::AST::VariableExpression(*csymbolName);
					success = true;
					return variableExpression;
				}
			}

			// Try to find the referenced parameter in the entire COLLADA file, using ordinary sid address
			// syntax
			const SidTreeNode* targetSidTreeNode = mDocumentProcessor->resolveSid( targetAddress );

			if ( !targetSidTreeNode )
			{
				// parameter not found
				String msg = "Parameter with sid address \"" + targetAddress.getSidAddressString() + "\" ";
				const String& formulaName = formula->getName();
				if ( !formulaName.empty() )
				{
					msg.append( "referenced in \"" + formulaName + "\" ");
				}
				msg.append( "could not be resolved." );

				success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_UNRESOLVED_PARAMETER, msg);
			}
			else
			{
				// parameter found
				if (targetSidTreeNode->getTargetType() == SidTreeNode::TARGETTYPECLASS_OBJECT)
				{
					// the parameter is an object, e.g. a joint
					const COLLADAFW::Object* object = targetSidTreeNode->getObjectTarget();
					COLLADABU_ASSERT(object);
					variableExpression = new MathML::AST::VariableExpression(object->getUniqueId().toAscii());
				}
				else if (targetSidTreeNode->getTargetType() == SidTreeNode::TARGETTYPECLASS_INTERMEDIATETARGETABLE)
				{
					// the parameter is an object, e.g. a joint
					const IntermediateTargetable* intermediateTargetable = targetSidTreeNode->getIntermediateTargetableTarget();
					COLLADABU_ASSERT(intermediateTargetable);
					const KinematicInstance* kinematicInstance = intermediateTargetableSafeCast<KinematicInstance>(intermediateTargetable);
					// for now we only support kinematic instances here
					COLLADABU_ASSERT(kinematicInstance);
					variableExpression = new MathML::AST::VariableExpression(kinematicInstance->getReplacingObjectUniqueId().toAscii());
				}
				else
				{
					// TODO: animatabel not supported yet
					success = false;
					return 0;
				}

			}
			success = true;
			return variableExpression;
		}

		success = false;
		return 0;
	}